

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void hd_context_shrink_table_size(nghttp2_hd_context *context,nghttp2_hd_map *map)

{
  nghttp2_mem *mem_00;
  nghttp2_hd_entry *ent_00;
  size_t sVar1;
  bool bVar2;
  nghttp2_hd_entry *ent;
  size_t idx;
  nghttp2_mem *mem;
  nghttp2_hd_map *map_local;
  nghttp2_hd_context *context_local;
  
  mem_00 = context->mem;
  while( true ) {
    bVar2 = false;
    if (context->hd_table_bufsize_max < context->hd_table_bufsize) {
      bVar2 = (context->hd_table).len != 0;
    }
    if (!bVar2) break;
    ent_00 = hd_ringbuf_get(&context->hd_table,(context->hd_table).len - 1);
    sVar1 = entry_room(((ent_00->nv).name)->len,((ent_00->nv).value)->len);
    context->hd_table_bufsize = context->hd_table_bufsize - sVar1;
    hd_ringbuf_pop_back(&context->hd_table);
    if (map != (nghttp2_hd_map *)0x0) {
      hd_map_remove(map,ent_00);
    }
    nghttp2_hd_entry_free(ent_00);
    nghttp2_mem_free(mem_00,ent_00);
  }
  return;
}

Assistant:

static void hd_context_shrink_table_size(nghttp2_hd_context *context,
                                         nghttp2_hd_map *map) {
  nghttp2_mem *mem;

  mem = context->mem;

  while (context->hd_table_bufsize > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {
    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);
    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);
    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }
}